

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# propagateNoContraction.cpp
# Opt level: O2

bool __thiscall
anon_unknown.dwarf_d3fac3::TSymbolDefinitionCollectingTraverser::visitBinary
          (TSymbolDefinitionCollectingTraverser *this,TVisit param_1,TIntermBinary *node)

{
  ObjectAccessChain *__v;
  TOperator op;
  uint __val;
  _Hashtable<std::__cxx11::string,std::pair<std::__cxx11::string_const,glslang::TIntermOperator*>,std::allocator<std::pair<std::__cxx11::string_const,glslang::TIntermOperator*>>,std::__detail::_Select1st,std::equal_to<std::__cxx11::string>,std::hash<std::__cxx11::string>,std::__detail::_Mod_range_hashing,std::__detail::_Default_ranged_hash,std::__detail::_Prime_rehash_policy,std::__detail::_Hashtable_traits<true,false,false>>
  *p_Var1;
  bool bVar2;
  char cVar3;
  int iVar4;
  undefined4 extraout_var;
  undefined4 extraout_var_00;
  undefined4 extraout_var_01;
  long *plVar5;
  long lVar6;
  long *plVar7;
  mapped_type *pmVar8;
  undefined4 extraout_var_03;
  undefined4 in_register_00000034;
  string local_78;
  TIntermBinary *local_58;
  ObjectAccessChain id_symbol;
  undefined4 extraout_var_02;
  
  (this->current_object_)._M_string_length = 0;
  __v = &this->current_object_;
  *(this->current_object_)._M_dataplus._M_p = '\0';
  iVar4 = (*(node->super_TIntermOperator).super_TIntermTyped.super_TIntermNode._vptr_TIntermNode
            [0x32])(node,CONCAT44(in_register_00000034,param_1));
  (**(code **)(*(long *)CONCAT44(extraout_var,iVar4) + 0x10))
            ((long *)CONCAT44(extraout_var,iVar4),this);
  op = (node->super_TIntermOperator).op;
  bVar2 = isAssignOperation(op);
  if (bVar2) {
    if ((this->current_object_)._M_string_length == 0) {
      __assert_fail("!current_object_.empty()",
                    "/workspace/llm4binary/github/license_c_cmakelists/DiligentGraphics[P]DiligentCore/ThirdParty/glslang/glslang/MachineIndependent/propagateNoContraction.cpp"
                    ,0x173,
                    "virtual bool (anonymous namespace)::TSymbolDefinitionCollectingTraverser::visitBinary(glslang::TVisit, glslang::TIntermBinary *)"
                   );
    }
    iVar4 = (*(node->super_TIntermOperator).super_TIntermTyped.super_TIntermNode._vptr_TIntermNode
              [0x32])(node);
    bVar2 = isPreciseObjectNode((TIntermTyped *)CONCAT44(extraout_var_00,iVar4));
    if (bVar2) {
      std::__detail::
      _Insert_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::__detail::_Identity,_std::equal_to<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::hash<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::__detail::_Mod_range_hashing,_std::__detail::_Default_ranged_hash,_std::__detail::_Prime_rehash_policy,_std::__detail::_Hashtable_traits<true,_true,_true>_>
      ::insert((_Insert_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::__detail::_Identity,_std::equal_to<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::hash<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::__detail::_Mod_range_hashing,_std::__detail::_Default_ranged_hash,_std::__detail::_Prime_rehash_policy,_std::__detail::_Hashtable_traits<true,_true,_true>_>
                *)this->precise_objects_,__v);
    }
    getFrontElement(&id_symbol,__v);
    p_Var1 = (_Hashtable<std::__cxx11::string,std::pair<std::__cxx11::string_const,glslang::TIntermOperator*>,std::allocator<std::pair<std::__cxx11::string_const,glslang::TIntermOperator*>>,std::__detail::_Select1st,std::equal_to<std::__cxx11::string>,std::hash<std::__cxx11::string>,std::__detail::_Mod_range_hashing,std::__detail::_Default_ranged_hash,std::__detail::_Prime_rehash_policy,std::__detail::_Hashtable_traits<true,false,false>>
              *)this->symbol_definition_mapping_;
    std::__cxx11::string::string((string *)&local_78,(string *)&id_symbol);
    local_58 = node;
    std::
    _Hashtable<std::__cxx11::string,std::pair<std::__cxx11::string_const,glslang::TIntermOperator*>,std::allocator<std::pair<std::__cxx11::string_const,glslang::TIntermOperator*>>,std::__detail::_Select1st,std::equal_to<std::__cxx11::string>,std::hash<std::__cxx11::string>,std::__detail::_Mod_range_hashing,std::__detail::_Default_ranged_hash,std::__detail::_Prime_rehash_policy,std::__detail::_Hashtable_traits<true,false,false>>
    ::_M_emplace<std::pair<std::__cxx11::string,glslang::TIntermBinary*>>(p_Var1,&local_78);
    std::__cxx11::string::_M_dispose();
    (this->current_object_)._M_string_length = 0;
    *(this->current_object_)._M_dataplus._M_p = '\0';
    iVar4 = (*(node->super_TIntermOperator).super_TIntermTyped.super_TIntermNode._vptr_TIntermNode
              [0x33])(node);
    (**(code **)(*(long *)CONCAT44(extraout_var_01,iVar4) + 0x10))
              ((long *)CONCAT44(extraout_var_01,iVar4),this);
    std::__cxx11::string::_M_dispose();
  }
  else {
    bVar2 = isDereferenceOperation(op);
    if (bVar2) {
      if (op == EOpIndexDirectStruct) {
        iVar4 = (*(node->super_TIntermOperator).super_TIntermTyped.super_TIntermNode.
                  _vptr_TIntermNode[0x33])(node);
        plVar5 = (long *)CONCAT44(extraout_var_02,iVar4);
        lVar6 = (**(code **)(*plVar5 + 0x28))(plVar5);
        if (lVar6 == 0) {
LAB_003c0dae:
          __assert_fail("node->getAsConstantUnion() && node->getAsConstantUnion()->isScalar()",
                        "/workspace/llm4binary/github/license_c_cmakelists/DiligentGraphics[P]DiligentCore/ThirdParty/glslang/glslang/MachineIndependent/propagateNoContraction.cpp"
                        ,0x86,
                        "unsigned int (anonymous namespace)::getStructIndexFromConstantUnion(glslang::TIntermTyped *)"
                       );
        }
        plVar7 = (long *)(**(code **)(*plVar5 + 0x28))(plVar5);
        cVar3 = (**(code **)(*plVar7 + 0x160))(plVar7);
        if (cVar3 == '\0') goto LAB_003c0dae;
        lVar6 = (**(code **)(*plVar5 + 0x28))(plVar5);
        __val = **(uint **)(*(long *)(lVar6 + 0xc0) + 8);
        std::__cxx11::string::push_back((char)__v);
        std::__cxx11::to_string(&local_78,__val);
        std::__cxx11::string::append((string *)__v);
        std::__cxx11::string::_M_dispose();
      }
      local_78._M_dataplus._M_p = (pointer)node;
      pmVar8 = std::__detail::
               _Map_base<glslang::TIntermTyped_*,_std::pair<glslang::TIntermTyped_*const,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::allocator<std::pair<glslang::TIntermTyped_*const,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>,_std::__detail::_Select1st,_std::equal_to<glslang::TIntermTyped_*>,_std::hash<glslang::TIntermTyped_*>,_std::__detail::_Mod_range_hashing,_std::__detail::_Default_ranged_hash,_std::__detail::_Prime_rehash_policy,_std::__detail::_Hashtable_traits<false,_false,_true>,_true>
               ::operator[]((_Map_base<glslang::TIntermTyped_*,_std::pair<glslang::TIntermTyped_*const,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::allocator<std::pair<glslang::TIntermTyped_*const,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>,_std::__detail::_Select1st,_std::equal_to<glslang::TIntermTyped_*>,_std::hash<glslang::TIntermTyped_*>,_std::__detail::_Mod_range_hashing,_std::__detail::_Default_ranged_hash,_std::__detail::_Prime_rehash_policy,_std::__detail::_Hashtable_traits<false,_false,_true>,_true>
                             *)this->accesschain_mapping_,(key_type *)&local_78);
      std::__cxx11::string::_M_assign((string *)pmVar8);
    }
    else {
      (this->current_object_)._M_string_length = 0;
      *(this->current_object_)._M_dataplus._M_p = '\0';
      iVar4 = (*(node->super_TIntermOperator).super_TIntermTyped.super_TIntermNode._vptr_TIntermNode
                [0x33])(node);
      (**(code **)(*(long *)CONCAT44(extraout_var_03,iVar4) + 0x10))
                ((long *)CONCAT44(extraout_var_03,iVar4),this);
    }
  }
  return false;
}

Assistant:

bool TSymbolDefinitionCollectingTraverser::visitBinary(glslang::TVisit /* visit */,
                                                       glslang::TIntermBinary* node)
{
    // Traverses the left node to build the access chain info for the object.
    current_object_.clear();
    node->getLeft()->traverse(this);

    if (isAssignOperation(node->getOp())) {
        // We should always be able to get an access chain for the left node.
        assert(!current_object_.empty());

        // If the left node object is 'precise', it is an initial precise object
        // specified in the shader source. Adds it to the initial work list to
        // process later.
        if (isPreciseObjectNode(node->getLeft())) {
            // The left node is an 'precise' object node, add its access chain to
            // the set of 'precise' objects. This is to collect the initial set
            // of 'precise' objects.
            precise_objects_.insert(current_object_);
        }
        // Gets the symbol ID from the object access chain, which should be the
        // first element recorded in the access chain.
        ObjectAccessChain id_symbol = getFrontElement(current_object_);
        // Adds a mapping from the symbol ID to this assignment operation node.
        symbol_definition_mapping_.insert(std::make_pair(id_symbol, node));

        // Traverses the right node, there may be other 'assignment'
        // operations in the right.
        current_object_.clear();
        node->getRight()->traverse(this);

    } else if (isDereferenceOperation(node->getOp())) {
        // The left node (parent node) is a struct type object. We need to
        // record the access chain information of the current node into its
        // object id.
        if (node->getOp() == glslang::EOpIndexDirectStruct) {
            unsigned struct_dereference_index = getStructIndexFromConstantUnion(node->getRight());
            current_object_.push_back(ObjectAccesschainDelimiter);
            current_object_.append(std::to_string(struct_dereference_index));
        }
        accesschain_mapping_[node] = current_object_;

        // For a dereference node, there is no need to traverse the right child
        // node as the right node should always be an integer type object.

    } else {
        // For other binary nodes, still traverse the right node.
        current_object_.clear();
        node->getRight()->traverse(this);
    }
    return false;
}